

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

char * __thiscall TadsHttpReqResult::next_header(TadsHttpReqResult *this,char *p)

{
  int iVar1;
  char *in_RSI;
  bool bVar2;
  char *local_18;
  
  local_18 = in_RSI;
  while( true ) {
    if (*local_18 == '\0') {
      return (char *)0x0;
    }
    if ((*local_18 == '\r') && (local_18[1] == '\n')) break;
    local_18 = local_18 + 1;
  }
  local_18 = local_18 + 2;
  while( true ) {
    bVar2 = false;
    if (*local_18 != '\0') {
      iVar1 = is_space(L'\0');
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_18 = local_18 + 1;
  }
  if ((*local_18 != '\0') && ((*local_18 != '\r' || (local_18[1] != '\n')))) {
    return local_18;
  }
  return (char *)0x0;
}

Assistant:

const char *next_header(const char *p)
    {
        /* scan ahead to the next \r\n sequence */
        for ( ; *p != '\0' ; ++p)
        {
            /* if this is a CR-LF sequence, it's the end of this header */
            if (*p == '\r' && *(p+1) == '\n')
            {
                /* skip spaces */
                for (p += 2 ; *p != '\0' && is_space(*p) ; ++p) ;

                /* if this was a blank line, we're out of headers */
                if (*p == '\0' || (*p == '\r' && *(p+1) == '\n'))
                    return 0;

                /* this is the next header */
                return p;
            }
        }

        /* no more headers */
        return 0;
    }